

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.h
# Opt level: O2

void __thiscall QWidgetItemV2::QWidgetItemV2(QWidgetItemV2 *this,QWidget *widget)

{
  (this->super_QWidgetItem).super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
  (this->super_QWidgetItem).wid = widget;
  (this->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem =
       (_func_int **)&PTR__QWidgetItemV2_007c0b98;
  (this->q_cachedMinimumSize).wd = -0x7b;
  (this->q_cachedMinimumSize).ht = -0x7b;
  (this->q_cachedSizeHint).wd = -0x7b;
  (this->q_cachedSizeHint).ht = -0x7b;
  (this->q_cachedMaximumSize).wd = -0x7b;
  (this->q_cachedMaximumSize).ht = -0x7b;
  this->q_cachedHfws[2].wd = -1;
  this->q_cachedHfws[2].ht = -1;
  this->q_cachedHfws[0].wd.m_i = -1;
  this->q_cachedHfws[0].ht.m_i = -1;
  this->q_cachedHfws[1].wd.m_i = -1;
  this->q_cachedHfws[1].ht.m_i = -1;
  this->q_firstCachedHfw = 0;
  this->q_hfwCacheSize = 0;
  this->d = (void *)0x0;
  if (*(long *)(*(long *)&widget->field_0x8 + 0xb0) != 0) {
    return;
  }
  *(QWidgetItemV2 **)(*(long *)&widget->field_0x8 + 0xb0) = this;
  return;
}

Assistant:

inline QLayoutItem::QLayoutItem(Qt::Alignment aalignment)
    : align(aalignment) { }